

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O2

void __thiscall
Js::ConcatStringMulti::ConcatStringMulti
          (ConcatStringMulti *this,uint slotCount,JavascriptString *a1,JavascriptString *a2,
          StaticType *stringTypeStatic)

{
  charcount_t cVar1;
  charcount_t cVar2;
  JavascriptString *pJVar3;
  
  ConcatStringBase::ConcatStringBase((ConcatStringBase *)this,stringTypeStatic);
  *(undefined ***)this = &PTR_Finalize_0138fb50;
  this->slotCount = slotCount;
  memset(this + 1,0,(ulong)slotCount << 3);
  pJVar3 = CompoundString::GetImmutableOrScriptUnreferencedString(a1);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptString> *)(this + 1),pJVar3);
  pJVar3 = CompoundString::GetImmutableOrScriptUnreferencedString(a2);
  Memory::WriteBarrierPtr<Js::JavascriptString>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptString> *)&this[1].field_0x8,pJVar3);
  cVar1 = JavascriptString::GetLength(a1);
  cVar2 = JavascriptString::GetLength(a2);
  JavascriptString::SetLength((JavascriptString *)this,cVar1 + cVar2);
  return;
}

Assistant:

ConcatStringMulti::ConcatStringMulti(uint slotCount, JavascriptString * a1, JavascriptString * a2, StaticType* stringTypeStatic) :
        ConcatStringBase(stringTypeStatic), slotCount(slotCount)
    {
#if DBG
        ClearArray(m_slots, slotCount);
#endif
        m_slots[0] = CompoundString::GetImmutableOrScriptUnreferencedString(a1);
        m_slots[1] = CompoundString::GetImmutableOrScriptUnreferencedString(a2);

        this->SetLength(a1->GetLength() + a2->GetLength());
    }